

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O3

int __thiscall
flow::LoadInstr::clone(LoadInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Value *variable;
  LoadInstr *this_00;
  
  variable = (Value *)**(undefined8 **)(__fn + 0x50);
  this_00 = (LoadInstr *)operator_new(0x68);
  LoadInstr(this_00,variable,(string *)(__fn + 0x10));
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)this_00;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> LoadInstr::clone() {
  return std::make_unique<LoadInstr>(variable(), name());
}